

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O0

void ImGui_ImplSDL2_SetGamepadMode
               (ImGui_ImplSDL2_GamepadMode mode,_SDL_GameController **manual_gamepads_array,
               int manual_gamepads_count)

{
  ImGui_ImplSDL2_Data *this;
  int in_EDX;
  ImGui_ImplSDL2_GamepadMode in_EDI;
  int n;
  ImGui_ImplSDL2_Data *bd;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  
  this = ImGui_ImplSDL2_GetBackendData();
  ImGui_ImplSDL2_CloseGamepads();
  if (in_EDI == ImGui_ImplSDL2_GamepadMode_Manual) {
    for (iVar1 = 0; iVar1 < in_EDX; iVar1 = iVar1 + 1) {
      ImVector<_SDL_GameController_*>::push_back
                ((ImVector<_SDL_GameController_*> *)this,
                 (_SDL_GameController **)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
    }
  }
  else {
    this->WantUpdateGamepadsList = true;
  }
  this->GamepadMode = in_EDI;
  return;
}

Assistant:

void ImGui_ImplSDL2_SetGamepadMode(ImGui_ImplSDL2_GamepadMode mode, struct _SDL_GameController** manual_gamepads_array, int manual_gamepads_count)
{
    ImGui_ImplSDL2_Data* bd = ImGui_ImplSDL2_GetBackendData();
    ImGui_ImplSDL2_CloseGamepads();
    if (mode == ImGui_ImplSDL2_GamepadMode_Manual)
    {
        IM_ASSERT(manual_gamepads_array != nullptr && manual_gamepads_count > 0);
        for (int n = 0; n < manual_gamepads_count; n++)
            bd->Gamepads.push_back(manual_gamepads_array[n]);
    }
    else
    {
        IM_ASSERT(manual_gamepads_array == nullptr && manual_gamepads_count <= 0);
        bd->WantUpdateGamepadsList = true;
    }
    bd->GamepadMode = mode;
}